

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

void bam_aux_append(bam1_t *b,char *tag,char type,int len,uint8_t *data)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint8_t *puVar4;
  
  iVar1 = b->l_data;
  iVar2 = len + iVar1 + 3;
  b->l_data = iVar2;
  if (b->m_data < iVar2) {
    uVar3 = len + iVar1 + 2;
    uVar3 = (int)uVar3 >> 1 | uVar3;
    uVar3 = (int)uVar3 >> 2 | uVar3;
    uVar3 = (int)uVar3 >> 4 | uVar3;
    uVar3 = (int)uVar3 >> 8 | uVar3;
    iVar2 = ((int)uVar3 >> 0x10 | uVar3) + 1;
    b->m_data = iVar2;
    puVar4 = (uint8_t *)realloc(b->data,(long)iVar2);
    b->data = puVar4;
  }
  else {
    puVar4 = b->data;
  }
  puVar4[iVar1] = *tag;
  b->data[(long)iVar1 + 1] = tag[1];
  b->data[(long)iVar1 + 2] = type;
  memcpy(b->data + (long)iVar1 + 3,data,(long)len);
  return;
}

Assistant:

void bam_aux_append(bam1_t *b, const char tag[2], char type, int len, uint8_t *data)
{
    int ori_len = b->l_data;
    b->l_data += 3 + len;
    if (b->m_data < b->l_data) {
        b->m_data = b->l_data;
        kroundup32(b->m_data);
        b->data = (uint8_t*)realloc(b->data, b->m_data);
    }
    b->data[ori_len] = tag[0]; b->data[ori_len + 1] = tag[1];
    b->data[ori_len + 2] = type;
    memcpy(b->data + ori_len + 3, data, len);
}